

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  Impl *pIVar1;
  anon_class_1_0_00000001 local_45 [13];
  Mapper<const_std::map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>_&>
  local_38 [2];
  undefined1 local_28 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  
  lock.ptr = (Impl *)this;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_28,
             &this->impl);
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_28);
  kj::_::
  Mapper<const_std::map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>_&>
  ::Mapper(local_38,&pIVar1->entries);
  kj::_::
  Mapper<const_std::map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>_&>
  ::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:1016:12)>
            (__return_storage_ptr__,local_38,local_45);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }